

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O2

void __thiscall UnifiedRegex::TrigramAlphabet::InitTrigramMap(TrigramAlphabet *this)

{
  int i;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  char cVar4;
  
  this->input = (char16 *)0x0;
  for (uVar1 = 0; uVar1 != 0xdd; uVar1 = uVar1 + 1) {
    uVar3 = uVar1 >> 3 & 0x1fffffff;
    cVar4 = 'A';
    if ((((uint)uVar3 | (uint)uVar1) & 4) == 0) {
      cVar4 = ((byte)(uVar1 >> 2) & 0x30 | (byte)uVar1 & 7) + ((byte)uVar3 & 7) * '\x04';
    }
    this->trigramMap[uVar1] = cVar4;
  }
  for (lVar2 = 0; lVar2 != 0x3200; lVar2 = lVar2 + 200) {
    *(undefined4 *)((long)this->trigramStarts[0].patterns + lVar2 + -8) = 0;
  }
  return;
}

Assistant:

void TrigramAlphabet::InitTrigramMap() {
        input=NULL;
        // set up mapping from 9 bits to trigram
        for (int i=0;i<TrigramMapSize;i++) {
            int t1=i>>6;
            int t2=(i>>3)&0x7;
            int t3=i&0x7;
            if ((t1>=AlphaCount)||(t2>=AlphaCount)||(t3>=AlphaCount)) {
                trigramMap[i]=TrigramNotInPattern;
            }
            else {
                // number of trigram
                trigramMap[i]=(char)((t1<<4)+(t2<<2)+t3);
            }
        }

        for (int j=0;j<TrigramCount;j++) {
            trigramStarts[j].count=0;
        }
    }